

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseConfig.cpp
# Opt level: O0

optional<ConfigKey> * ConfigKey::parse(string_view value)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar1;
  reference this;
  char *in_RDX;
  size_t in_RSI;
  optional<ConfigKey> *in_RDI;
  ConfigKey *opt;
  iterator __end1;
  iterator __begin1;
  vector<ConfigKey,_std::allocator<ConfigKey>_> *__range1;
  ConfigKey *in_stack_ffffffffffffff58;
  optional<ConfigKey> *this_00;
  vector<ConfigKey,_std::allocator<ConfigKey>_> *in_stack_ffffffffffffff70;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> in_stack_ffffffffffffff88;
  int local_4c;
  __normal_iterator<ConfigKey_*,_std::vector<ConfigKey,_std::allocator<ConfigKey>_>_> local_40;
  undefined1 local_38 [24];
  undefined1 *local_20;
  size_t local_18;
  char *local_10;
  
  this_00 = in_RDI;
  local_18 = in_RSI;
  local_10 = in_RDX;
  available();
  local_20 = local_38;
  local_40._M_current =
       (ConfigKey *)
       std::vector<ConfigKey,_std::allocator<ConfigKey>_>::begin(in_stack_ffffffffffffff58);
  std::vector<ConfigKey,_std::allocator<ConfigKey>_>::end
            ((vector<ConfigKey,_std::allocator<ConfigKey>_> *)in_stack_ffffffffffffff58);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<ConfigKey_*,_std::vector<ConfigKey,_std::allocator<ConfigKey>_>_>
                        *)this_00,
                       (__normal_iterator<ConfigKey_*,_std::vector<ConfigKey,_std::allocator<ConfigKey>_>_>
                        *)in_stack_ffffffffffffff58);
    if (!bVar1) {
      local_4c = 2;
LAB_00175d48:
      std::vector<ConfigKey,_std::allocator<ConfigKey>_>::~vector(in_stack_ffffffffffffff70);
      if (local_4c != 1) {
        std::optional<ConfigKey>::optional(this_00);
      }
      return in_RDI;
    }
    this = __gnu_cxx::
           __normal_iterator<ConfigKey_*,_std::vector<ConfigKey,_std::allocator<ConfigKey>_>_>::
           operator*(&local_40);
    in_stack_ffffffffffffff58 = (ConfigKey *)key_abi_cxx11_(this);
    std::__cxx11::string::operator_cast_to_basic_string_view((string *)in_stack_ffffffffffffff58);
    __y._M_str = local_10;
    __y._M_len = local_18;
    bVar1 = std::operator==(in_stack_ffffffffffffff88,__y);
    if (bVar1) {
      std::optional<ConfigKey>::optional<const_ConfigKey_&,_true>(this_00,in_stack_ffffffffffffff58)
      ;
      local_4c = 1;
      goto LAB_00175d48;
    }
    __gnu_cxx::__normal_iterator<ConfigKey_*,_std::vector<ConfigKey,_std::allocator<ConfigKey>_>_>::
    operator++(&local_40);
  } while( true );
}

Assistant:

std::optional<ConfigKey> ConfigKey::parse(std::string_view value) {
    for (const auto &opt : ConfigKey::available()) {
        if (opt.key() == value) {
            return opt;
        }
    }
    return std::nullopt;
}